

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_int128_tests(void)

{
  uint64_t uVar1;
  int64_t iVar2;
  int i;
  secp256k1_int128 res_1;
  secp256k1_uint128 res;
  int local_2c;
  secp256k1_int128 local_28;
  secp256k1_uint128 local_18;
  
  secp256k1_u128_mul(&local_18,0xffffffffffffffff,0xffffffffffffffff);
  secp256k1_u128_accum_mul(&local_18,0xffffffffffffffff,0xffffffffffffffff);
  uVar1 = secp256k1_u128_to_u64(&local_18);
  if (uVar1 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x7b9,"test condition failed: secp256k1_u128_to_u64(&res) == 2");
    abort();
  }
  uVar1 = secp256k1_u128_hi_u64(&local_18);
  if (uVar1 != 0xfffffffffffffffc) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x7ba,"test condition failed: secp256k1_u128_hi_u64(&res) == 18446744073709551612U");
    abort();
  }
  secp256k1_i128_mul(&local_28,0x7fffffffffffffff,0x7fffffffffffffff);
  secp256k1_i128_accum_mul(&local_28,0x7fffffffffffffff,0x7fffffffffffffff);
  uVar1 = secp256k1_i128_to_u64(&local_28);
  if (uVar1 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x7c2,"test condition failed: secp256k1_i128_to_u64(&res) == 2");
    abort();
  }
  secp256k1_i128_accum_mul(&local_28,4,0x7fffffffffffffff);
  secp256k1_i128_accum_mul(&local_28,1,1);
  uVar1 = secp256k1_i128_to_u64(&local_28);
  if (uVar1 != 0xffffffffffffffff) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x7c5,"test condition failed: secp256k1_i128_to_u64(&res) == UINT64_MAX");
    abort();
  }
  secp256k1_i128_rshift(&local_28,0x40);
  iVar2 = secp256k1_i128_to_i64(&local_28);
  if (iVar2 != 0x7fffffffffffffff) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x7c7,"test condition failed: secp256k1_i128_to_i64(&res) == INT64_MAX");
    abort();
  }
  secp256k1_i128_mul(&local_28,0x7fffffffffffffff,-0x8000000000000000);
  uVar1 = secp256k1_i128_to_u64(&local_28);
  if (uVar1 != 0x8000000000000000) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x7cb,"test condition failed: secp256k1_i128_to_u64(&res) == (uint64_t)INT64_MIN");
    abort();
  }
  secp256k1_i128_accum_mul(&local_28,0x7fffffffffffffff,-0x8000000000000000);
  uVar1 = secp256k1_i128_to_u64(&local_28);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x7cd,"test condition failed: secp256k1_i128_to_u64(&res) == 0");
    abort();
  }
  secp256k1_i128_accum_mul(&local_28,2,-0x8000000000000000);
  uVar1 = secp256k1_i128_to_u64(&local_28);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,1999,"test condition failed: secp256k1_i128_to_u64(&res) == 0");
    abort();
  }
  secp256k1_i128_rshift(&local_28,0x40);
  iVar2 = secp256k1_i128_to_i64(&local_28);
  if (iVar2 != -0x8000000000000000) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x7d1,"test condition failed: secp256k1_i128_to_i64(&res) == INT64_MIN");
    abort();
  }
  for (local_2c = 0; local_2c < COUNT * 0x100; local_2c = local_2c + 1) {
    run_int128_test_case();
  }
  return;
}

Assistant:

static void run_int128_tests(void) {
    {   /* secp256k1_u128_accum_mul */
        secp256k1_uint128 res;

        /* Check secp256k1_u128_accum_mul overflow */
        secp256k1_u128_mul(&res, UINT64_MAX, UINT64_MAX);
        secp256k1_u128_accum_mul(&res, UINT64_MAX, UINT64_MAX);
        CHECK(secp256k1_u128_to_u64(&res) == 2);
        CHECK(secp256k1_u128_hi_u64(&res) == 18446744073709551612U);
    }
    {   /* secp256k1_u128_accum_mul */
        secp256k1_int128 res;

        /* Compute INT128_MAX = 2^127 - 1 with secp256k1_i128_accum_mul */
        secp256k1_i128_mul(&res, INT64_MAX, INT64_MAX);
        secp256k1_i128_accum_mul(&res, INT64_MAX, INT64_MAX);
        CHECK(secp256k1_i128_to_u64(&res) == 2);
        secp256k1_i128_accum_mul(&res, 4, 9223372036854775807);
        secp256k1_i128_accum_mul(&res, 1, 1);
        CHECK(secp256k1_i128_to_u64(&res) == UINT64_MAX);
        secp256k1_i128_rshift(&res, 64);
        CHECK(secp256k1_i128_to_i64(&res) == INT64_MAX);

        /* Compute INT128_MIN = - 2^127 with secp256k1_i128_accum_mul */
        secp256k1_i128_mul(&res, INT64_MAX, INT64_MIN);
        CHECK(secp256k1_i128_to_u64(&res) == (uint64_t)INT64_MIN);
        secp256k1_i128_accum_mul(&res, INT64_MAX, INT64_MIN);
        CHECK(secp256k1_i128_to_u64(&res) == 0);
        secp256k1_i128_accum_mul(&res, 2, INT64_MIN);
        CHECK(secp256k1_i128_to_u64(&res) == 0);
        secp256k1_i128_rshift(&res, 64);
        CHECK(secp256k1_i128_to_i64(&res) == INT64_MIN);
    }
    {
        /* Randomized tests. */
        int i;
        for (i = 0; i < 256 * COUNT; ++i) run_int128_test_case();
    }
}